

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::abortRead(BlockedPumpFrom *this)

{
  AsyncPipe *this_00;
  StringPtr cancelReason;
  Own<kj::_::PromiseNode> local_308;
  BlockedPumpFrom *local_2f0;
  Runnable local_2e8;
  undefined1 *local_2e0;
  BlockedPumpFrom **local_2d8;
  NullableValue<kj::Exception> local_2d0;
  NullableValue<kj::Exception> e;
  
  cancelReason.content.size_ = 0x17;
  cancelReason.content.ptr = "abortRead() was called";
  Canceler::cancel(&this->canceler,cancelReason);
  local_2d8 = &local_2f0;
  local_308.disposer = (Disposer *)0x0;
  local_308.ptr = (PromiseNode *)0x0;
  local_2e8._vptr_Runnable = (_func_int **)&PTR_run_0067a108;
  local_2f0 = this;
  local_2e0 = (undefined1 *)&local_308;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_2d0,&local_2e8);
  kj::_::NullableValue<kj::Exception>::NullableValue(&e,&local_2d0);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_2d0);
  if (e.isSet == true) {
    Promise<void>::Promise((Promise<void> *)&local_2d0,&e.field_1.value);
    Own<kj::_::PromiseNode>::operator=(&local_308,(Own<kj::_::PromiseNode> *)&local_2d0);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_2d0);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&e);
  Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&this->checkEofTask,&local_308);
  Own<kj::_::PromiseNode>::dispose(&local_308);
  this_00 = this->pipe;
  if ((BlockedPumpFrom *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (AsyncIoStream *)0x0;
  }
  AsyncPipe::abortRead(this_00);
  return;
}

Assistant:

void abortRead() override {
      canceler.cancel("abortRead() was called");

      // The input might have reached EOF, but we haven't detected it yet because we haven't tried
      // to read that far. If we had not optimized tryPumpFrom() and instead used the default
      // pumpTo() implementation, then the input would not have called write() again once it
      // reached EOF, and therefore the abortRead() on the other end would *not* propagate an
      // exception! We need the same behavior here. To that end, we need to detect if we're at EOF
      // by reading one last byte.
      checkEofTask = kj::evalNow([&]() {
        static char junk;
        return input.tryRead(&junk, 1, 1).then([this](uint64_t n) {
          if (n == 0) {
            fulfiller.fulfill(kj::cp(pumpedSoFar));
          } else {
            fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "read end of pipe was aborted"));
          }
        }).eagerlyEvaluate([this](kj::Exception&& e) {
          fulfiller.reject(kj::mv(e));
        });
      });

      pipe.endState(*this);
      pipe.abortRead();
    }